

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_reset_dirty_sparc(CPUState *cpu,ram_addr_t start1,ram_addr_t length)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  pvVar2 = cpu->env_ptr;
  lVar4 = (long)pvVar2 + -0x824;
  lVar5 = 0;
  do {
    uVar6 = (int)(*(ulong *)((long)pvVar2 + lVar5 * 0x10 + -0x40) >> 6) + 1;
    if (uVar6 != 0) {
      lVar7 = 0;
      do {
        lVar3 = *(long *)((long)pvVar2 + lVar5 * 0x10 + -0x38);
        uVar1 = *(uint *)(lVar3 + 4 + lVar7);
        if (((uVar1 & 0xe40) == 0) &&
           (((uVar1 & 0xfffff000) - start1) + *(long *)(lVar3 + 0x10 + lVar7) < length)) {
          *(uint *)(lVar3 + 4 + lVar7) = uVar1 | 0x400;
        }
        lVar7 = lVar7 + 0x40;
      } while ((ulong)uVar6 << 6 != lVar7);
    }
    lVar7 = 0;
    do {
      uVar6 = *(uint *)(lVar4 + lVar7);
      if (((uVar6 & 0xe40) == 0) &&
         (((uVar6 & 0xfffff000) - start1) + *(long *)(lVar4 + 0xc + lVar7) < length)) {
        *(uint *)(lVar4 + lVar7) = uVar6 | 0x400;
      }
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0x200);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x2b0;
  } while (lVar5 != 3);
  return;
}

Assistant:

void tlb_reset_dirty(CPUState *cpu, ram_addr_t start1, ram_addr_t length)
{
    struct uc_struct *uc = cpu->uc;
    CPUArchState *env;

    int mmu_idx;

    env = cpu->env_ptr;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        unsigned int i;
        unsigned int n = tlb_n_entries(&env_tlb(env)->f[mmu_idx]);

        for (i = 0; i < n; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->f[mmu_idx].table[i],
                                         start1, length);
        }

        for (i = 0; i < CPU_VTLB_SIZE; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->d[mmu_idx].vtable[i],
                                         start1, length);
        }
    }
}